

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3423::EvaluateDeflection(ChElementShellANCF_3423 *this,double *def)

{
  Scalar SVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Scalar *pSVar7;
  long lVar8;
  ChMatrixNM<double,_8,_3> *pCVar9;
  double dVar10;
  double local_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  undefined1 local_48 [16];
  double local_38;
  
  pCVar9 = &this->m_d0;
  local_78 = 0.0;
  dStack_70 = 0.0;
  local_90 = 0.0;
  for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 2) {
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_1> *)pCVar9,lVar8,0);
    SVar1 = *pSVar7;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_1> *)pCVar9,lVar8,1);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = SVar1;
    auVar2 = vmovhpd_avx(auVar4,*pSVar7);
    local_78 = local_78 + auVar2._0_8_;
    dStack_70 = dStack_70 + auVar2._8_8_;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_1> *)pCVar9,lVar8,2);
    local_90 = local_90 + *pSVar7;
  }
  pCVar9 = &this->m_d;
  dVar10 = 0.0;
  local_88 = 0.0;
  dStack_80 = 0.0;
  for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 2) {
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_1> *)pCVar9,lVar8,0);
    SVar1 = *pSVar7;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_1> *)pCVar9,lVar8,1);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = SVar1;
    auVar2 = vmovhpd_avx(auVar6,*pSVar7);
    local_88 = local_88 + auVar2._0_8_;
    dStack_80 = dStack_80 + auVar2._8_8_;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_8,_3,_1,_8,_3>,_1> *)pCVar9,lVar8,2);
    dVar10 = dVar10 + *pSVar7;
  }
  auVar2._8_8_ = dStack_80;
  auVar2._0_8_ = local_88;
  auVar5._8_8_ = dStack_70;
  auVar5._0_8_ = local_78;
  auVar2 = vsubpd_avx(auVar2,auVar5);
  local_38 = (dVar10 - local_90) * 0.25;
  auVar3._8_8_ = 0x3fd0000000000000;
  auVar3._0_8_ = 0x3fd0000000000000;
  local_48 = vmulpd_avx512vl(auVar2,auVar3);
  dVar10 = ChVector<double>::Length((ChVector<double> *)local_48);
  *def = dVar10;
  return;
}

Assistant:

void ChElementShellANCF_3423::EvaluateDeflection(double& def) {
    ChVector<> oldPos;
    ChVector<> newPos;
    ChVector<> defVec;

    for (int i = 0; i < 4; i++) {
        oldPos.x() += this->m_d0(2 * i, 0);
        oldPos.y() += this->m_d0(2 * i, 1);
        oldPos.z() += this->m_d0(2 * i, 2);
    }

    for (int i = 0; i < 4; i++) {
        newPos.x() += this->m_d(2 * i, 0);
        newPos.y() += this->m_d(2 * i, 1);
        newPos.z() += this->m_d(2 * i, 2);
    }

    defVec = (newPos - oldPos) / 4;
    def = defVec.Length();
}